

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

int __thiscall QMainWindowLayout::raise(QMainWindowLayout *this,int __sig)

{
  int extraout_EAX;
  QDockAreaLayoutInfo *this_00;
  undefined4 in_register_00000034;
  
  this_00 = dockInfo(this,(QWidget *)CONCAT44(in_register_00000034,__sig));
  if ((this_00 != (QDockAreaLayoutInfo *)0x0) && (this_00->tabbed == true)) {
    QDockAreaLayoutInfo::setCurrentTab(this_00,(QWidget *)CONCAT44(in_register_00000034,__sig));
    return extraout_EAX;
  }
  return (int)this_00;
}

Assistant:

void QMainWindowLayout::raise(QDockWidget *widget)
{
    QDockAreaLayoutInfo *info = dockInfo(widget);
    if (info == nullptr)
        return;
    if (!info->tabbed)
        return;
    info->setCurrentTab(widget);
}